

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

bool __thiscall Bstrlib::CBString::operator<(CBString *this,CBString *b)

{
  CBStringException *this_00;
  const_bstring local_88;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  CBStringException bstr__cppwrapper_exception;
  int retval;
  CBString *b_local;
  CBString *this_local;
  
  local_88 = (const_bstring)0x0;
  if (b != (CBString *)0x0) {
    local_88 = &b->super_tagbstring;
  }
  bstr__cppwrapper_exception.msg.field_2._12_4_ = bstrcmp(&this->super_tagbstring,local_88);
  if (bstr__cppwrapper_exception.msg.field_2._12_4_ == -0x8000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"CBString::Failure in compare (<)",&local_69);
    CBStringException::CBStringException((CBStringException *)local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_48);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  return (int)bstr__cppwrapper_exception.msg.field_2._12_4_ < 0;
}

Assistant:

bool CBString::operator < (const CBString& b) const {
	int retval;
	if (SHRT_MIN == (retval = bstrcmp ((bstring) this, (bstring)&b))) {
		bstringThrow ("Failure in compare (<)");
	}
	return retval < 0;
}